

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::counterBufferType(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  char *__s;
  iterator __position;
  int iVar1;
  TPoolAllocator *pTVar2;
  TType *this_00;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_01;
  undefined4 extraout_var;
  TTypeLoc member;
  TType blockType;
  TTypeLoc local_110;
  TString local_f0;
  TType local_c8;
  
  pTVar2 = GetThreadPoolAllocator();
  this_00 = (TType *)TPoolAllocator::allocate(pTVar2,0x98);
  TType::TType(this_00,EbtUint,EvqBuffer,1,0,0,false);
  __s = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->implicitCounterName;
  local_f0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_c8,
             __s,(pool_allocator<char> *)&local_f0);
  (*this_00->_vptr_TType[4])(this_00,&local_c8);
  pTVar2 = GetThreadPoolAllocator();
  this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
            TPoolAllocator::allocate(pTVar2,0x20);
  *(undefined8 *)this_01 = 0;
  *(undefined8 *)(this_01 + 8) = 0;
  *(undefined8 *)(this_01 + 0x10) = 0;
  *(undefined8 *)(this_01 + 0x18) = 0;
  pTVar2 = GetThreadPoolAllocator();
  *(TPoolAllocator **)this_01 = pTVar2;
  *(undefined8 *)(this_01 + 8) = 0;
  *(undefined8 *)(this_01 + 0x10) = 0;
  *(undefined8 *)(this_01 + 0x18) = 0;
  local_110.loc.column = loc->column;
  local_110.loc._20_4_ = *(undefined4 *)&loc->field_0x14;
  local_110.loc.name = loc->name;
  local_110.loc.string = loc->string;
  local_110.loc.line = loc->line;
  __position._M_current = *(TTypeLoc **)(this_01 + 0x10);
  local_110.type = this_00;
  if (__position._M_current == *(TTypeLoc **)(this_01 + 0x18)) {
    std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
    _M_realloc_insert<glslang::TTypeLoc_const&>(this_01,__position,&local_110);
  }
  else {
    ((__position._M_current)->loc).string = local_110.loc.string;
    ((__position._M_current)->loc).line = local_110.loc.line;
    ((__position._M_current)->loc).column = local_110.loc.column;
    *(undefined4 *)&((__position._M_current)->loc).field_0x14 = local_110.loc._20_4_;
    (__position._M_current)->type = this_00;
    ((__position._M_current)->loc).name = local_110.loc.name;
    *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 0x20;
  }
  local_f0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_f0,""
            );
  iVar1 = (*this_00->_vptr_TType[10])(this_00);
  TType::TType(&local_c8,(TTypeList *)this_01,&local_f0,(TQualifier *)CONCAT44(extraout_var,iVar1));
  local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0xffffffffffffff80 | 6;
  TType::shallowCopy(type,&local_c8);
  shareStructBufferType(this,type);
  return;
}

Assistant:

void HlslParseContext::counterBufferType(const TSourceLoc& loc, TType& type)
{
    // Counter type
    TType* counterType = new TType(EbtUint, EvqBuffer);
    counterType->setFieldName(intermediate.implicitCounterName);

    TTypeList* blockStruct = new TTypeList;
    TTypeLoc  member = { counterType, loc };
    blockStruct->push_back(member);

    TType blockType(blockStruct, "", counterType->getQualifier());
    blockType.getQualifier().storage = EvqBuffer;

    type.shallowCopy(blockType);
    shareStructBufferType(type);
}